

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall
CryptoUtil_ConvertSignatureFromDer_Test::TestBody(CryptoUtil_ConvertSignatureFromDer_Test *this)

{
  char *message;
  AssertHelper AStack_a8;
  string local_a0;
  AssertionResult gtest_ar;
  ByteData signature;
  SigHashType sig_type;
  string hex_sig;
  string der_sig;
  
  std::__cxx11::string::string
            ((string *)&der_sig,
             "30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601"
             ,(allocator *)&hex_sig);
  std::__cxx11::string::string
            ((string *)&hex_sig,
             "773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226"
             ,(allocator *)&local_a0);
  cfd::core::SigHashType::SigHashType(&sig_type);
  cfd::core::ByteData::ByteData((ByteData *)&local_a0,&der_sig);
  cfd::core::CryptoUtil::ConvertSignatureFromDer(&signature,(ByteData *)&local_a0,&sig_type);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_a0,&signature);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"signature.GetHex().c_str()","hex_sig.c_str()",
             local_a0._M_dataplus._M_p,hex_sig._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_a0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_a0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x222,message);
    testing::internal::AssertHelper::operator=(&AStack_a8,(Message *)&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_a8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_a0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&signature);
  std::__cxx11::string::~string((string *)&hex_sig);
  std::__cxx11::string::~string((string *)&der_sig);
  return;
}

Assistant:

TEST(CryptoUtil, ConvertSignatureFromDer) {
  std::string der_sig = "30440220773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca4702201907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b2422601";
  std::string hex_sig = "773420c0ded41a55b1f1205cfb632f08f3f911a53e7338a0dac73ec6cbe3ca471907434d046185abedc5afddc2761a642bccc70af6d22b46394f1d04a8b24226";
  SigHashType sig_type;
  ByteData signature = CryptoUtil::ConvertSignatureFromDer(ByteData(der_sig), &sig_type);
  EXPECT_STREQ(signature.GetHex().c_str(), hex_sig.c_str());
}